

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

uint16_t * __thiscall
capnp::SchemaLoader::Validator::makeMemberInfoArray(Validator *this,uint32_t *count)

{
  undefined4 uVar1;
  bool bVar2;
  size_t sVar3;
  unsigned_short *puVar4;
  Fault local_88;
  Fault f;
  Entry *member;
  Iterator __end2;
  Iterator __begin2;
  TreeMap<capnp::Text::Reader,_unsigned_int> *__range2;
  undefined1 auStack_28 [4];
  uint pos;
  ArrayPtr<unsigned_short> result;
  uint32_t *count_local;
  Validator *this_local;
  
  result.size_ = (size_t)count;
  sVar3 = kj::TreeMap<capnp::Text::Reader,_unsigned_int>::size(&this->members);
  *(int *)result.size_ = (int)sVar3;
  _auStack_28 = kj::Arena::allocateArray<unsigned_short>
                          (&this->loader->arena,(ulong)*(uint *)result.size_);
  __range2._4_4_ = 0;
  kj::TreeMap<capnp::Text::Reader,_unsigned_int>::begin
            ((Iterator *)&__end2.inner.row,&this->members);
  kj::TreeMap<capnp::Text::Reader,_unsigned_int>::end((Iterator *)&member,&this->members);
  while( true ) {
    bVar2 = kj::_::
            MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
            ::operator!=((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                          *)&__end2.inner.row,
                         (MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                          *)&member);
    if (!bVar2) break;
    f.exception = (Exception *)
                  kj::_::
                  MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                  ::operator*((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                               *)&__end2.inner.row);
    uVar1 = *(undefined4 *)&((f.exception)->ownFile).content.disposer;
    puVar4 = kj::ArrayPtr<unsigned_short>::operator[]
                       ((ArrayPtr<unsigned_short> *)auStack_28,(ulong)__range2._4_4_);
    *puVar4 = (unsigned_short)uVar1;
    kj::_::
    MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
    ::operator++((MappedIterator<kj::_::BTreeImpl::Iterator,_kj::_::TableMapping<kj::TreeMap<capnp::Text::Reader,_unsigned_int>::Entry>_>
                  *)&__end2.inner.row);
    __range2._4_4_ = __range2._4_4_ + 1;
  }
  if (__range2._4_4_ == *(uint *)result.size_) {
    puVar4 = kj::ArrayPtr<unsigned_short>::begin((ArrayPtr<unsigned_short> *)auStack_28);
    return puVar4;
  }
  kj::_::Debug::Fault::Fault
            (&local_88,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/schema-loader.c++"
             ,0x112,FAILED,"pos == *count","");
  kj::_::Debug::Fault::fatal(&local_88);
}

Assistant:

const uint16_t* makeMemberInfoArray(uint32_t* count) {
    *count = members.size();
    kj::ArrayPtr<uint16_t> result = loader.arena.allocateArray<uint16_t>(*count);
    uint pos = 0;
    for (auto& member: members) {
      result[pos++] = member.value;
    }
    KJ_DASSERT(pos == *count);
    return result.begin();
  }